

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

_Bool validate_fp16(ggml_fp16_t f,size_t i)

{
  _Bool _Var1;
  undefined8 in_RSI;
  ggml_fp16_t in_DI;
  _Bool local_1;
  
  _Var1 = isinf_fp16(in_DI);
  if (_Var1) {
    fprintf(_stderr,"ggml_validate_row_data: found inf value at block %zu\n",in_RSI);
    local_1 = false;
  }
  else {
    _Var1 = isnan_fp16(in_DI);
    if (_Var1) {
      fprintf(_stderr,"ggml_validate_row_data: found nan value at block %zu\n",in_RSI);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool validate_fp16(ggml_fp16_t f, size_t i) {
    if (isinf_fp16(f)) {
        fprintf(stderr, "ggml_validate_row_data: found inf value at block %zu\n", i);
        return false;
    }

    if (isnan_fp16(f)) {
        fprintf(stderr, "ggml_validate_row_data: found nan value at block %zu\n", i);
        return false;
    }

    return true;
}